

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O0

int __thiscall GGWave::rxTakeData(GGWave *this,TxRxData *dst)

{
  uchar *data;
  ggvector<unsigned_char> *in_RSI;
  long in_RDI;
  int res;
  ggvector<unsigned_char> local_30;
  int local_1c;
  int local_4;
  
  if (*(int *)(in_RDI + 0x128) == 0) {
    local_4 = 0;
  }
  else {
    local_1c = *(int *)(in_RDI + 0x128);
    *(undefined4 *)(in_RDI + 0x128) = 0;
    if (local_1c != -1) {
      data = ggvector<unsigned_char>::data((ggvector<unsigned_char> *)(in_RDI + 0x130));
      ggvector<unsigned_char>::ggvector(&local_30,data,local_1c);
      ggvector<unsigned_char>::assign(in_RSI,&local_30);
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

int GGWave::rxTakeData(TxRxData & dst) {
    if (m_rx.dataLength == 0) return 0;

    auto res = m_rx.dataLength;
    m_rx.dataLength = 0;

    if (res != -1) {
        dst.assign({ m_rx.data.data(), res });
    }

    return res;
}